

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O0

void __thiscall PeriodicTable::PeriodicTable(PeriodicTable *this)

{
  undefined1 local_70 [8];
  element x;
  uint16_t z;
  PeriodicTable *this_local;
  
  std::vector<element,_std::allocator<element>_>::vector(&this->table);
  for (x.half_lives.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._6_2_ = 1;
      x.half_lives.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_2_ < 0x77;
      x.half_lives.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_2_ =
           x.half_lives.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._6_2_ + 1) {
    element::element((element *)local_70);
    x.name.field_2._8_2_ =
         x.half_lives.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._6_2_;
    std::__cxx11::string::operator=
              ((string *)local_70,
               (string *)
               (element_names_abi_cxx11_ +
               x.half_lives.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._6_2_));
    addIsotopesTo(this,(element *)local_70);
    std::vector<element,_std::allocator<element>_>::push_back(&this->table,(value_type *)local_70);
    element::~element((element *)local_70);
  }
  return;
}

Assistant:

PeriodicTable::PeriodicTable()
{
    for(uint16_t z = 1; z <= N_ELEMENTS; z++)
    {
        element x;
        x.z = z;
        x.name = element_names[z];
        addIsotopesTo(x);
        table.push_back(x);
    }
}